

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitDestructuredValueOrInitializer
               (ParseNodePtr lhsElementNode,RegSlot rhsLocation,ParseNodePtr initializer,
               bool isNonPatternAssignmentTarget,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  ByteCodeWriter *pBVar1;
  RegSlot local_44;
  RegSlot rhsLocationTmp;
  ByteCodeLabel end;
  ByteCodeLabel useDefault;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  bool isNonPatternAssignmentTarget_local;
  ParseNodePtr initializer_local;
  RegSlot rhsLocation_local;
  ParseNodePtr lhsElementNode_local;
  
  local_44 = rhsLocation;
  if (initializer != (ParseNodePtr)0x0) {
    local_44 = FuncInfo::AcquireTmpRegister(funcInfo);
    pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
    labelID = Js::ByteCodeWriter::DefineLabel(pBVar1);
    pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
    labelID_00 = Js::ByteCodeWriter::DefineLabel(pBVar1);
    pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::BrReg2
              (pBVar1,BrSrEq_A,labelID,rhsLocation,funcInfo->undefinedConstantRegister);
    pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg2(pBVar1,Ld_A,local_44,rhsLocation);
    pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Br(pBVar1,labelID_00);
    pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::MarkLabel(pBVar1,labelID);
    Emit(initializer,byteCodeGenerator,funcInfo,0,false,false);
    pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg2(pBVar1,Ld_A_ReuseLoc,local_44,initializer->location);
    FuncInfo::ReleaseLoc(funcInfo,initializer);
    pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::MarkLabel(pBVar1,labelID_00);
  }
  if (lhsElementNode->nop == knopArrayPattern) {
    EmitDestructuredArray(lhsElementNode,local_44,byteCodeGenerator,funcInfo);
  }
  else if (lhsElementNode->nop == knopObjectPattern) {
    EmitDestructuredObject(lhsElementNode,local_44,byteCodeGenerator,funcInfo);
  }
  else if (isNonPatternAssignmentTarget) {
    EmitAssignment((ParseNode *)0x0,lhsElementNode,local_44,byteCodeGenerator,funcInfo);
  }
  else {
    EmitDestructuredElement(lhsElementNode,local_44,byteCodeGenerator,funcInfo);
  }
  if (initializer != (ParseNodePtr)0x0) {
    FuncInfo::ReleaseTmpRegister(funcInfo,local_44);
  }
  return;
}

Assistant:

void EmitDestructuredValueOrInitializer(ParseNodePtr lhsElementNode,
    Js::RegSlot rhsLocation,
    ParseNodePtr initializer,
    bool isNonPatternAssignmentTarget,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    // If we have initializer we need to see if the destructured value is undefined or not - if it is undefined we need to assign initializer

    Js::ByteCodeLabel useDefault = -1;
    Js::ByteCodeLabel end = -1;
    Js::RegSlot rhsLocationTmp = rhsLocation;

    if (initializer != nullptr)
    {
        rhsLocationTmp = funcInfo->AcquireTmpRegister();

        useDefault = byteCodeGenerator->Writer()->DefineLabel();
        end = byteCodeGenerator->Writer()->DefineLabel();

        byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrSrEq_A, useDefault, rhsLocation, funcInfo->undefinedConstantRegister);
        byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, rhsLocationTmp, rhsLocation);

        byteCodeGenerator->Writer()->Br(end);
        byteCodeGenerator->Writer()->MarkLabel(useDefault);

        Emit(initializer, byteCodeGenerator, funcInfo, false/*isConstructorCall*/);
        byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, rhsLocationTmp, initializer->location);
        funcInfo->ReleaseLoc(initializer);

        byteCodeGenerator->Writer()->MarkLabel(end);
    }

    if (lhsElementNode->nop == knopArrayPattern)
    {
        EmitDestructuredArray(lhsElementNode, rhsLocationTmp, byteCodeGenerator, funcInfo);
    }
    else if (lhsElementNode->nop == knopObjectPattern)
    {
        EmitDestructuredObject(lhsElementNode, rhsLocationTmp, byteCodeGenerator, funcInfo);
    }
    else if (isNonPatternAssignmentTarget)
    {
        EmitAssignment(nullptr, lhsElementNode, rhsLocationTmp, byteCodeGenerator, funcInfo);
    }
    else
    {
        EmitDestructuredElement(lhsElementNode, rhsLocationTmp, byteCodeGenerator, funcInfo);
    }

    if (initializer != nullptr)
    {
        funcInfo->ReleaseTmpRegister(rhsLocationTmp);
    }
}